

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

string * __thiscall Chainstate::ToString_abi_cxx11_(Chainstate *this)

{
  bool bVar1;
  CBlockIndex *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  CBlockIndex *tip;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  base_blob<256U> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int *in_stack_ffffffffffffff78;
  char **in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  byte bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_55;
  int local_54;
  char *local_50;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RSI;
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             (char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
             (AnnotatedMixin<std::recursive_mutex> *)0x14a99ec);
  __s = CChain::Tip((CChain *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<uint256> *)
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  local_50 = "ibd";
  if (bVar1) {
    local_50 = "snapshot";
  }
  if (__s == (CBlockIndex *)0x0) {
    local_54 = -1;
  }
  else {
    local_54 = __s->nHeight;
  }
  bVar2 = 0;
  if (__s == (CBlockIndex *)0x0) {
    std::allocator<char>::allocator();
    bVar2 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)__s,(allocator<char> *)CONCAT17(1,in_stack_ffffffffffffff88));
  }
  else {
    CBlockIndex::GetBlockHash((CBlockIndex *)CONCAT44(local_54,in_stack_ffffffffffffff58));
    base_blob<256u>::ToString_abi_cxx11_(in_stack_ffffffffffffff50);
  }
  tinyformat::format<char_const*,int,std::__cxx11::string>
            ((char *)CONCAT17(bVar2,in_stack_ffffffffffffff88),in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78,in_RSI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  if ((bVar2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_55);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::string Chainstate::ToString()
{
    AssertLockHeld(::cs_main);
    CBlockIndex* tip = m_chain.Tip();
    return strprintf("Chainstate [%s] @ height %d (%s)",
                     m_from_snapshot_blockhash ? "snapshot" : "ibd",
                     tip ? tip->nHeight : -1, tip ? tip->GetBlockHash().ToString() : "null");
}